

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.hpp
# Opt level: O0

string * inja::htmlescape(string *__return_storage_ptr__,string *data)

{
  long lVar1;
  undefined1 *puVar2;
  ulong uVar3;
  long local_38;
  size_t pos;
  string *data_local;
  string *buffer;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  ::std::__cxx11::string::size();
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (local_38 = 0; lVar1 = ::std::__cxx11::string::size(), local_38 != lVar1;
      local_38 = local_38 + 1) {
    puVar2 = (undefined1 *)::std::__cxx11::string::operator[]((ulong)data);
    switch(*puVar2) {
    case 0x22:
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      break;
    default:
      uVar3 = ::std::__cxx11::string::operator[]((ulong)data);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__,uVar3);
      break;
    case 0x26:
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      break;
    case 0x27:
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      break;
    case 0x3c:
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      break;
    case 0x3e:
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string htmlescape(const std::string& data) {
  std::string buffer;
  buffer.reserve((unsigned int)(1.1 * data.size()));
  for (size_t pos = 0; pos != data.size(); ++pos) {
    switch (data[pos]) {
      case '&':  buffer.append("&amp;");       break;
      case '\"': buffer.append("&quot;");      break;
      case '\'': buffer.append("&apos;");      break;
      case '<':  buffer.append("&lt;");        break;
      case '>':  buffer.append("&gt;");        break;
      default:   buffer.append(&data[pos], 1); break;
    }
  }
  return buffer;
}